

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.h
# Opt level: O0

BigInt * __thiscall BigInt::operator*(BigInt *__return_storage_ptr__,BigInt *this,BigInt *v)

{
  pointer *this_00;
  allocator<long_long> *this_01;
  int iVar1;
  iterator __first;
  iterator __last;
  size_type sVar2;
  size_type sVar3;
  reference pvVar4;
  BigInt local_150;
  vector<long_long,_std::allocator<long_long>_> local_130;
  long local_118;
  long local_110;
  longlong cur;
  int local_100;
  int carry;
  int i;
  vll c;
  value_type local_d8 [3];
  allocator<long_long> local_b9;
  __normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_> local_b8;
  __normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_> local_b0;
  undefined1 local_a8 [8];
  vll b;
  undefined1 local_78 [8];
  vll a;
  undefined1 local_50 [8];
  vector<long_long,_std::allocator<long_long>_> b6;
  vector<long_long,_std::allocator<long_long>_> a6;
  BigInt *v_local;
  BigInt *this_local;
  BigInt *res;
  
  convert_base((vector<long_long,_std::allocator<long_long>_> *)
               &b6.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&this->vector_value,base_digits,6);
  convert_base((vector<long_long,_std::allocator<long_long>_> *)local_50,&v->vector_value,
               base_digits,6);
  this_00 = &b6.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  __first = std::vector<long_long,_std::allocator<long_long>_>::begin
                      ((vector<long_long,_std::allocator<long_long>_> *)this_00);
  __last = std::vector<long_long,_std::allocator<long_long>_>::end
                     ((vector<long_long,_std::allocator<long_long>_> *)this_00);
  this_01 = (allocator<long_long> *)
            ((long)&b.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<long_long>::allocator(this_01);
  std::vector<long_long,std::allocator<long_long>>::
  vector<__gnu_cxx::__normal_iterator<long_long*,std::vector<long_long,std::allocator<long_long>>>,void>
            ((vector<long_long,std::allocator<long_long>> *)local_78,
             (__normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_>)
             __first._M_current,
             (__normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_>)
             __last._M_current,this_01);
  std::allocator<long_long>::~allocator
            ((allocator<long_long> *)
             ((long)&b.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  local_b0._M_current =
       (longlong *)
       std::vector<long_long,_std::allocator<long_long>_>::begin
                 ((vector<long_long,_std::allocator<long_long>_> *)local_50);
  local_b8._M_current =
       (longlong *)
       std::vector<long_long,_std::allocator<long_long>_>::end
                 ((vector<long_long,_std::allocator<long_long>_> *)local_50);
  std::allocator<long_long>::allocator(&local_b9);
  std::vector<long_long,std::allocator<long_long>>::
  vector<__gnu_cxx::__normal_iterator<long_long*,std::vector<long_long,std::allocator<long_long>>>,void>
            ((vector<long_long,std::allocator<long_long>> *)local_a8,local_b0,local_b8,&local_b9);
  std::allocator<long_long>::~allocator(&local_b9);
  while( true ) {
    sVar2 = std::vector<long_long,_std::allocator<long_long>_>::size
                      ((vector<long_long,_std::allocator<long_long>_> *)local_78);
    sVar3 = std::vector<long_long,_std::allocator<long_long>_>::size
                      ((vector<long_long,_std::allocator<long_long>_> *)local_a8);
    if (sVar3 <= sVar2) break;
    local_d8[2] = 0;
    std::vector<long_long,_std::allocator<long_long>_>::push_back
              ((vector<long_long,_std::allocator<long_long>_> *)local_78,local_d8 + 2);
  }
  while( true ) {
    sVar2 = std::vector<long_long,_std::allocator<long_long>_>::size
                      ((vector<long_long,_std::allocator<long_long>_> *)local_a8);
    sVar3 = std::vector<long_long,_std::allocator<long_long>_>::size
                      ((vector<long_long,_std::allocator<long_long>_> *)local_78);
    if (sVar3 <= sVar2) break;
    local_d8[1] = 0;
    std::vector<long_long,_std::allocator<long_long>_>::push_back
              ((vector<long_long,_std::allocator<long_long>_> *)local_a8,local_d8 + 1);
  }
  while( true ) {
    sVar2 = std::vector<long_long,_std::allocator<long_long>_>::size
                      ((vector<long_long,_std::allocator<long_long>_> *)local_78);
    sVar3 = std::vector<long_long,_std::allocator<long_long>_>::size
                      ((vector<long_long,_std::allocator<long_long>_> *)local_78);
    if ((sVar2 & sVar3 - 1) == 0) break;
    local_d8[0] = 0;
    std::vector<long_long,_std::allocator<long_long>_>::push_back
              ((vector<long_long,_std::allocator<long_long>_> *)local_78,local_d8);
    c.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::vector<long_long,_std::allocator<long_long>_>::push_back
              ((vector<long_long,_std::allocator<long_long>_> *)local_a8,
               (value_type *)
               &c.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  karatsubaMultiply((vll *)&i,(vll *)local_78,(vll *)local_a8);
  carry._3_1_ = 0;
  BigInt(__return_storage_ptr__);
  __return_storage_ptr__->sign = this->sign * v->sign;
  cur._4_4_ = 0;
  for (local_100 = 0; iVar1 = local_100,
      sVar2 = std::vector<long_long,_std::allocator<long_long>_>::size
                        ((vector<long_long,_std::allocator<long_long>_> *)&i), iVar1 < (int)sVar2;
      local_100 = local_100 + 1) {
    pvVar4 = std::vector<long_long,_std::allocator<long_long>_>::operator[]
                       ((vector<long_long,_std::allocator<long_long>_> *)&i,(long)local_100);
    local_110 = *pvVar4 + (long)cur._4_4_;
    local_118 = (long)((int)local_110 +
                      ((int)(SUB168(SEXT816(local_110) * SEXT816(0x431bde82d7b634db),8) >> 0x12) -
                      (SUB164(SEXT816(local_110) * SEXT816(0x431bde82d7b634db),0xc) >> 0x1f)) *
                      -1000000);
    std::vector<long_long,_std::allocator<long_long>_>::push_back
              (&__return_storage_ptr__->vector_value,&local_118);
    cur._4_4_ = (int)(local_110 / 1000000);
  }
  convert_base(&local_130,&__return_storage_ptr__->vector_value,6,base_digits);
  std::vector<long_long,_std::allocator<long_long>_>::operator=
            (&__return_storage_ptr__->vector_value,&local_130);
  std::vector<long_long,_std::allocator<long_long>_>::~vector(&local_130);
  trim(&local_150,__return_storage_ptr__);
  ~BigInt(&local_150);
  carry._3_1_ = 1;
  std::vector<long_long,_std::allocator<long_long>_>::~vector
            ((vector<long_long,_std::allocator<long_long>_> *)&i);
  std::vector<long_long,_std::allocator<long_long>_>::~vector
            ((vector<long_long,_std::allocator<long_long>_> *)local_a8);
  std::vector<long_long,_std::allocator<long_long>_>::~vector
            ((vector<long_long,_std::allocator<long_long>_> *)local_78);
  std::vector<long_long,_std::allocator<long_long>_>::~vector
            ((vector<long_long,_std::allocator<long_long>_> *)local_50);
  std::vector<long_long,_std::allocator<long_long>_>::~vector
            ((vector<long_long,_std::allocator<long_long>_> *)
             &b6.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return __return_storage_ptr__;
}

Assistant:

BigInt operator*(const BigInt &v) const { //! multiplication operator overloading
        /* //! works with deque
         BigInt result;
         BigInt This = *this;
         for (long long &vectorValue : that.vector_value) {
             result += This * vectorValue;
             This.vector_value.push_front(0); //! shift the least significant
         }

         return result;*/
        //! log on the value space 24 ms :(
        /* //! log mul
          if (that == __ONE__)
              return (*this);

          BigInt result;
          pair<BigInt, int> halfDiv = that.Half();
          result = (*this) * halfDiv.first;
          result = result.Double();
          //result += result;
          if (halfDiv.second)
              result = result + (*this);
          return result;*/


        vector<long long> a6 = convert_base(this->vector_value, base_digits, 6);
        vector<long long> b6 = convert_base(v.vector_value, base_digits, 6);
        vll a(a6.begin(), a6.end());
        vll b(b6.begin(), b6.end());
        while (a.size() < b.size())
            a.push_back(0);
        while (b.size() < a.size())
            b.push_back(0);
        while (a.size() & (a.size() - 1))
            a.push_back(0), b.push_back(0);
        vll c = karatsubaMultiply(a, b);
        BigInt res;
        res.sign = sign * v.sign;
        for (int i = 0, carry = 0; i < (int) c.size(); i++) {
            long long cur = c[i] + carry;
            res.vector_value.push_back((int) (cur % 1000000));
            carry = (int) (cur / 1000000);
        }
        res.vector_value = convert_base(res.vector_value, 6, base_digits);
        res.trim();
        return res;
    }